

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.h
# Opt level: O2

bool __thiscall
soul::UTF8Reader::advanceIfStartsWith<char_const*,char_const*,char_const*>
          (UTF8Reader *this,char *text,char *others,char *others_1,char *others_2)

{
  bool bVar1;
  
  bVar1 = advanceIfStartsWith(this,text);
  if (bVar1) {
    return true;
  }
  bVar1 = advanceIfStartsWith<char_const*,char_const*>(this,others,others_1,others_2);
  return bVar1;
}

Assistant:

bool advanceIfStartsWith (const char* text, Args... others)      { return advanceIfStartsWith (text) || advanceIfStartsWith (others...); }